

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

FT_Bool sfnt_get_name_id(TT_Face face,FT_UShort id,FT_Int *win,FT_Int *apple)

{
  ushort uVar1;
  FT_UShort *pFVar2;
  ulong uVar3;
  
  *win = -1;
  *apple = -1;
  uVar1 = face->num_names;
  if ((ulong)uVar1 != 0) {
    pFVar2 = &((face->name_table).names)->stringLength;
    uVar3 = 0;
    do {
      if ((pFVar2[-1] == id) && (*pFVar2 != 0)) {
        if (((TT_NameRec *)(pFVar2 + -4))->platformID == 1) {
          if ((pFVar2[-3] == 0) && ((pFVar2[-2] == 0 || (*apple == -1)))) {
            *apple = (FT_Int)uVar3;
          }
        }
        else if (((((TT_NameRec *)(pFVar2 + -4))->platformID == 3) && (pFVar2[-3] < 2)) &&
                ((pFVar2[-2] == 0x409 || (*win == -1)))) {
          *win = (FT_Int)uVar3;
        }
      }
      uVar3 = uVar3 + 1;
      pFVar2 = pFVar2 + 0x10;
    } while (uVar1 != uVar3);
  }
  if (-1 < *win) {
    return '\x01';
  }
  return -1 < *apple;
}

Assistant:

static FT_Bool
  sfnt_get_name_id( TT_Face    face,
                    FT_UShort  id,
                    FT_Int    *win,
                    FT_Int    *apple )
  {
    FT_Int  n;


    *win   = -1;
    *apple = -1;

    for ( n = 0; n < face->num_names; n++ )
    {
      TT_Name  name = face->name_table.names + n;


      if ( name->nameID == id && name->stringLength > 0 )
      {
        if ( IS_WIN( name ) && ( name->languageID == 0x409 || *win == -1 ) )
          *win = n;

        if ( IS_APPLE( name ) && ( name->languageID == 0 || *apple == -1 ) )
          *apple = n;
      }
    }

    return ( *win >= 0 ) || ( *apple >= 0 );
  }